

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SupportVectorClassifier::MergeFrom
          (SupportVectorClassifier *this,SupportVectorClassifier *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  Kernel *pKVar4;
  SparseSupportVectors *pSVar5;
  DenseSupportVectors *pDVar6;
  StringVector *pSVar7;
  Int64Vector *pIVar8;
  StringVector *from_00;
  Int64Vector *from_01;
  SparseSupportVectors *from_02;
  DenseSupportVectors *from_03;
  LogFinisher local_131;
  LogMessage local_130;
  LogMessage local_f8;
  LogMessage local_c0;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_f8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/SVM.pb.cc"
               ,0xfa5);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_f8,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_f8);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c0,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
  }
  iVar1 = (from->numberofsupportvectorsperclass_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<int>::Reserve
              (&this->numberofsupportvectorsperclass_,
               iVar1 + (this->numberofsupportvectorsperclass_).current_size_);
    memcpy(((this->numberofsupportvectorsperclass_).rep_)->elements +
           (this->numberofsupportvectorsperclass_).current_size_,
           ((from->numberofsupportvectorsperclass_).rep_)->elements,
           (long)(from->numberofsupportvectorsperclass_).current_size_ << 2);
    (this->numberofsupportvectorsperclass_).current_size_ =
         (this->numberofsupportvectorsperclass_).current_size_ +
         (from->numberofsupportvectorsperclass_).current_size_;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
            (&(this->coefficients_).super_RepeatedPtrFieldBase,
             &(from->coefficients_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar1 = (from->rho_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->rho_,iVar1 + (this->rho_).current_size_)
    ;
    memcpy(((this->rho_).rep_)->elements + (this->rho_).current_size_,((from->rho_).rep_)->elements,
           (long)(from->rho_).current_size_ << 3);
    (this->rho_).current_size_ = (this->rho_).current_size_ + (from->rho_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->proba_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve
              (&this->proba_,iVar1 + (this->proba_).current_size_);
    memcpy(((this->proba_).rep_)->elements + (this->proba_).current_size_,
           ((from->proba_).rep_)->elements,(long)(from->proba_).current_size_ << 3);
    (this->proba_).current_size_ = (this->proba_).current_size_ + (from->proba_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_130,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_130,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_131,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_130);
  }
  iVar1 = (from->probb_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve
              (&this->probb_,iVar1 + (this->probb_).current_size_);
    memcpy(((this->probb_).rep_)->elements + (this->probb_).current_size_,
           ((from->probb_).rep_)->elements,(long)(from->probb_).current_size_ << 3);
    (this->probb_).current_size_ = (this->probb_).current_size_ + (from->probb_).current_size_;
  }
  if ((from != (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) &&
     (from->kernel_ != (Kernel *)0x0)) {
    if (this->kernel_ == (Kernel *)0x0) {
      pKVar4 = (Kernel *)operator_new(0x20);
      Kernel::Kernel(pKVar4);
      this->kernel_ = pKVar4;
    }
    pKVar4 = from->kernel_;
    if (pKVar4 == (Kernel *)0x0) {
      pKVar4 = (Kernel *)&_Kernel_default_instance_;
    }
    Kernel::MergeFrom(this->kernel_,pKVar4);
  }
  if (from->_oneof_case_[0] == 4) {
    if (this->_oneof_case_[0] != 4) {
      clear_supportVectors(this);
      this->_oneof_case_[0] = 4;
      pDVar6 = (DenseSupportVectors *)operator_new(0x30);
      DenseSupportVectors::DenseSupportVectors(pDVar6);
      (this->supportVectors_).densesupportvectors_ = pDVar6;
    }
    pDVar6 = (this->supportVectors_).densesupportvectors_;
    if (from->_oneof_case_[0] == 4) {
      from_03 = (from->supportVectors_).densesupportvectors_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_03 = (DenseSupportVectors *)&_DenseSupportVectors_default_instance_;
    }
    DenseSupportVectors::MergeFrom(pDVar6,from_03);
  }
  else if (from->_oneof_case_[0] == 3) {
    if (this->_oneof_case_[0] != 3) {
      clear_supportVectors(this);
      this->_oneof_case_[0] = 3;
      pSVar5 = (SparseSupportVectors *)operator_new(0x30);
      SparseSupportVectors::SparseSupportVectors(pSVar5);
      (this->supportVectors_).sparsesupportvectors_ = pSVar5;
    }
    pSVar5 = (this->supportVectors_).sparsesupportvectors_;
    if (from->_oneof_case_[0] == 3) {
      from_02 = (from->supportVectors_).sparsesupportvectors_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_02 = (SparseSupportVectors *)&_SparseSupportVectors_default_instance_;
    }
    SparseSupportVectors::MergeFrom(pSVar5,from_02);
  }
  if (from->_oneof_case_[1] == 0x65) {
    if (this->_oneof_case_[1] != 0x65) {
      clear_ClassLabels(this);
      this->_oneof_case_[1] = 0x65;
      pIVar8 = (Int64Vector *)operator_new(0x28);
      Int64Vector::Int64Vector(pIVar8);
      (this->ClassLabels_).int64classlabels_ = pIVar8;
    }
    pIVar8 = (this->ClassLabels_).int64classlabels_;
    if (from->_oneof_case_[1] == 0x65) {
      from_01 = (from->ClassLabels_).int64classlabels_;
    }
    else {
      from_01 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(pIVar8,from_01);
  }
  else if (from->_oneof_case_[1] == 100) {
    if (this->_oneof_case_[1] != 100) {
      clear_ClassLabels(this);
      this->_oneof_case_[1] = 100;
      pSVar7 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(pSVar7);
      (this->ClassLabels_).stringclasslabels_ = pSVar7;
    }
    pSVar7 = (this->ClassLabels_).stringclasslabels_;
    if (from->_oneof_case_[1] == 100) {
      from_00 = (from->ClassLabels_).stringclasslabels_;
    }
    else {
      from_00 = StringVector::default_instance();
    }
    StringVector::MergeFrom(pSVar7,from_00);
  }
  return;
}

Assistant:

void SupportVectorClassifier::MergeFrom(const SupportVectorClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SupportVectorClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  numberofsupportvectorsperclass_.MergeFrom(from.numberofsupportvectorsperclass_);
  coefficients_.MergeFrom(from.coefficients_);
  rho_.MergeFrom(from.rho_);
  proba_.MergeFrom(from.proba_);
  probb_.MergeFrom(from.probb_);
  if (from.has_kernel()) {
    mutable_kernel()->::CoreML::Specification::Kernel::MergeFrom(from.kernel());
  }
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}